

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

VariableData *
anon_unknown.dwarf_94284::AllocateTemporary(ExpressionContext *ctx,SynBase *source,TypeBase *type)

{
  uint uVar1;
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InplaceStr name;
  VariableData *this;
  
  uVar1 = ctx->unnamedVariableCount;
  ctx->unnamedVariableCount = uVar1 + 1;
  name = GetTemporaryName(ctx,uVar1,(char *)0x0);
  if (type->isGeneric != true) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    this = (VariableData *)CONCAT44(extraout_var,iVar3);
    allocator = ctx->allocator;
    scope = ctx->scope;
    uVar1 = type->alignment;
    iVar3 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_00,iVar3),name);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              (this,allocator,source,scope,uVar1,type,
               (SynIdentifier *)CONCAT44(extraout_var_00,iVar3),0,uniqueId);
    bVar2 = IsLookupOnlyVariable(ctx,this);
    if (bVar2) {
      this->lookupOnly = true;
    }
    this->isAlloca = true;
    this->offset = 0xffffffff;
    ExpressionContext::AddVariable(ctx,this,false);
    return this;
  }
  __assert_fail("!type->isGeneric",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x348,
                "VariableData *(anonymous namespace)::AllocateTemporary(ExpressionContext &, SynBase *, TypeBase *)"
               );
}

Assistant:

VariableData* AllocateTemporary(ExpressionContext &ctx, SynBase *source, TypeBase *type)
	{
		InplaceStr name = GetTemporaryName(ctx, ctx.unnamedVariableCount++, NULL);

		assert(!type->isGeneric);

		VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(name), 0, ctx.uniqueVariableId++);

		if (IsLookupOnlyVariable(ctx, variable))
			variable->lookupOnly = true;

		variable->isAlloca = true;
		variable->offset = ~0u;

		ctx.AddVariable(variable, false);

		return variable;
	}